

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

char * __thiscall QFileSystemModelPrivate::index(QFileSystemModelPrivate *this,char *__s,int __c)

{
  int iVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  uint uVar11;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  char *pcVar12;
  QStringView QVar13;
  
  pcVar12 = (char *)CONCAT44(in_register_00000014,__c);
  if (((pcVar12 == (char *)0x0) ||
      (lVar2 = *(long *)(pcVar12 + 0x40), __s + 0x138 == pcVar12 || lVar2 == 0)) ||
     (pcVar12[0x4d] == '\0')) {
    *(undefined8 *)this = 0xffffffffffffffff;
    *(undefined8 *)&this->field_0x8 = 0;
    *(undefined8 *)&this->field_0x10 = 0;
  }
  else {
    cVar3 = __s[8];
    cVar4 = __s[9];
    cVar5 = __s[10];
    cVar6 = __s[0xb];
    cVar7 = __s[0xc];
    cVar8 = __s[0xd];
    cVar9 = __s[0xe];
    cVar10 = __s[0xf];
    QVar13.m_data = *(storage_type_conflict **)(pcVar12 + 8);
    QVar13.m_size = *(qsizetype *)(pcVar12 + 0x10);
    uVar11 = QtPrivate::QStringList_indexOf((QList_conflict *)(lVar2 + 0x20),QVar13,0,CaseSensitive)
    ;
    if (*(int *)(__s + 0x1ac) != 0) {
      iVar1 = *(int *)(lVar2 + 0x48);
      if (iVar1 == -1) {
        uVar11 = ~uVar11 + *(int *)(lVar2 + 0x30);
      }
      else if ((int)uVar11 < iVar1) {
        uVar11 = iVar1 + ~uVar11;
      }
    }
    *(uint *)this = uVar11;
    *(undefined4 *)&this->field_0x4 = in_ECX;
    *(char **)&this->field_0x8 = pcVar12;
    this->field_0x10 = cVar3;
    this->field_0x11 = cVar4;
    this->field_0x12 = cVar5;
    this->field_0x13 = cVar6;
    this->field_0x14 = cVar7;
    this->field_0x15 = cVar8;
    this->field_0x16 = cVar9;
    this->field_0x17 = cVar10;
  }
  return (char *)this;
}

Assistant:

QModelIndex QFileSystemModelPrivate::index(const QFileSystemModelPrivate::QFileSystemNode *node, int column) const
{
    Q_Q(const QFileSystemModel);
    QFileSystemModelPrivate::QFileSystemNode *parentNode = (node ? node->parent : nullptr);
    if (node == &root || !parentNode)
        return QModelIndex();

    // get the parent's row
    Q_ASSERT(node);
    if (!node->isVisible)
        return QModelIndex();

    int visualRow = translateVisibleLocation(parentNode, parentNode->visibleLocation(node->fileName));
    return q->createIndex(visualRow, column, const_cast<QFileSystemNode*>(node));
}